

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amqp_definitions.c
# Opt level: O0

AMQP_VALUE amqpvalue_create_transfer(TRANSFER_HANDLE transfer)

{
  TRANSFER_INSTANCE *transfer_instance;
  AMQP_VALUE result;
  TRANSFER_HANDLE transfer_local;
  
  if (transfer == (TRANSFER_HANDLE)0x0) {
    transfer_instance = (TRANSFER_INSTANCE *)0x0;
  }
  else {
    transfer_instance = (TRANSFER_INSTANCE *)amqpvalue_clone(transfer->composite_value);
  }
  return (AMQP_VALUE)transfer_instance;
}

Assistant:

AMQP_VALUE amqpvalue_create_transfer(TRANSFER_HANDLE transfer)
{
    AMQP_VALUE result;

    if (transfer == NULL)
    {
        result = NULL;
    }
    else
    {
        TRANSFER_INSTANCE* transfer_instance = (TRANSFER_INSTANCE*)transfer;
        result = amqpvalue_clone(transfer_instance->composite_value);
    }

    return result;
}